

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *
pbrt::
returnArray<pbrt::Point3<float>,pstd::vector<double,pstd::pmr::polymorphic_allocator<double>>,pbrt::Point3<float>(*)(double_const*,pbrt::FileLoc_const*)>
          (vector<double,_pstd::pmr::polymorphic_allocator<double>_> *values,ParsedParameter *param,
          int nPerItem,_func_Point3<float>_double_ptr_FileLoc_ptr *convert)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  size_t sVar4;
  const_reference pvVar5;
  reference pvVar6;
  int in_ECX;
  long in_RDX;
  vector<double,_pstd::pmr::polymorphic_allocator<double>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  code *in_R8;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar7 [12];
  size_t i;
  size_t n;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *v;
  allocator_type *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff58;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *in_stack_ffffffffffffff60;
  code *pcVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  int *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fmt;
  FileLoc *in_stack_ffffffffffffff90;
  ulong local_50;
  
  fmt = in_RDI;
  bVar3 = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::empty
                    ((vector<double,_pstd::pmr::polymorphic_allocator<double>_> *)0x7525a8);
  if (bVar3) {
    ErrorExit<std::__cxx11::string_const&>
              ((FileLoc *)in_RDI,(char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  }
  sVar4 = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::size(in_RSI);
  if (sVar4 % (ulong)(long)in_ECX == 0) {
    *(undefined1 *)(in_RDX + 0xb8) = 1;
    sVar4 = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::size(in_RSI);
    std::allocator<pbrt::Point3<float>_>::allocator((allocator<pbrt::Point3<float>_> *)0x752676);
    std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::allocator<pbrt::Point3<float>_>::~allocator((allocator<pbrt::Point3<float>_> *)0x752699);
    for (local_50 = 0; local_50 < sVar4 / (ulong)(long)in_ECX; local_50 = local_50 + 1) {
      pcVar8 = in_R8;
      pvVar5 = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::operator[]
                         (in_RSI,(long)in_ECX * local_50);
      auVar7 = (*pcVar8)(pvVar5,in_RDX + 0x40);
      auVar2._8_8_ = extraout_XMM0_Qb;
      auVar2._0_8_ = auVar7._0_8_;
      uVar1 = vmovlpd_avx(auVar2);
      pvVar6 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                         ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                          in_RDI,local_50);
      (pvVar6->super_Tuple3<pbrt::Point3,_float>).x = (float)(int)uVar1;
      (pvVar6->super_Tuple3<pbrt::Point3,_float>).y = (float)(int)((ulong)uVar1 >> 0x20);
      (pvVar6->super_Tuple3<pbrt::Point3,_float>).z = auVar7._8_4_;
    }
    return (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)fmt;
  }
  ErrorExit<std::__cxx11::string_const&,int&>
            (in_stack_ffffffffffffff90,(char *)fmt,in_RDI,in_stack_ffffffffffffff78);
}

Assistant:

static std::vector<ReturnType> returnArray(const ValuesType &values,
                                           const ParsedParameter &param, int nPerItem,
                                           C convert) {
    if (values.empty())
        ErrorExit(&param.loc, "No values provided for \"%s\".", param.name);
    if (values.size() % nPerItem)
        ErrorExit(&param.loc, "Number of values provided for \"%s\" not a multiple of %d",
                  param.name, nPerItem);

    param.lookedUp = true;
    size_t n = values.size() / nPerItem;
    std::vector<ReturnType> v(n);
    for (size_t i = 0; i < n; ++i)
        v[i] = convert(&values[nPerItem * i], &param.loc);
    return v;
}